

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O3

Watcher * __thiscall
efsw::FileWatcherInotify::watcherContainsDirectory(FileWatcherInotify *this,string *dir)

{
  pointer pcVar1;
  _Alloc_hider __s2;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  Watcher *pWVar4;
  string watcherPath;
  string local_70;
  string local_50;
  
  FileSystem::dirRemoveSlashAtEnd(dir);
  pcVar1 = (dir->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + dir->_M_string_length);
  FileSystem::pathRemoveFileName(&local_70,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  FileSystem::dirAddSlashAtEnd(&local_70);
  Mutex::lock(&this->mWatchesLock);
  __s2._M_p = local_70._M_dataplus._M_p;
  for (p_Var3 = (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->mWatches)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    pWVar4 = (Watcher *)p_Var3[1]._M_parent;
    if (((_Base_ptr)(pWVar4->Directory)._M_string_length == (_Base_ptr)local_70._M_string_length) &&
       (((_Base_ptr)local_70._M_string_length == (_Base_ptr)0x0 ||
        (iVar2 = bcmp((_Base_ptr)(pWVar4->Directory)._M_dataplus._M_p,__s2._M_p,
                      local_70._M_string_length), iVar2 == 0)))) goto LAB_001227e4;
  }
  pWVar4 = (Watcher *)0x0;
LAB_001227e4:
  Mutex::unlock(&this->mWatchesLock);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return pWVar4;
}

Assistant:

Watcher* FileWatcherInotify::watcherContainsDirectory( std::string dir ) {
	FileSystem::dirRemoveSlashAtEnd( dir );
	std::string watcherPath = FileSystem::pathRemoveFileName( dir );
	FileSystem::dirAddSlashAtEnd( watcherPath );
	Lock lock( mWatchesLock );

	for ( WatchMap::iterator it = mWatches.begin(); it != mWatches.end(); ++it ) {
		Watcher* watcher = it->second;
		if ( watcher->Directory == watcherPath )
			return watcher;
	}

	return NULL;
}